

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_ApproximateSize::_Run(_Test_ApproximateSize *this)

{
  size_t one_key_size;
  size_t two_keys_size;
  size_t local_1e8;
  WriteBatch batch;
  size_t post_delete_size;
  size_t empty_size;
  char *local_1b0;
  char *local_1a8;
  
  WriteBatch::WriteBatch(&batch);
  empty_size = WriteBatch::ApproximateSize(&batch);
  local_1b0 = "foo";
  local_1a8 = (char *)0x3;
  two_keys_size = (size_t)anon_var_dwarf_8e9b;
  local_1e8 = 3;
  WriteBatch::Put(&batch,(Slice *)&local_1b0,(Slice *)&two_keys_size);
  one_key_size = WriteBatch::ApproximateSize(&batch);
  test::Tester::Tester
            ((Tester *)&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x7c);
  test::Tester::IsLt<unsigned_long,unsigned_long>((Tester *)&local_1b0,&empty_size,&one_key_size);
  test::Tester::~Tester((Tester *)&local_1b0);
  local_1b0 = "baz";
  local_1a8 = (char *)0x3;
  two_keys_size = (size_t)anon_var_dwarf_8eb9;
  local_1e8 = 3;
  WriteBatch::Put(&batch,(Slice *)&local_1b0,(Slice *)&two_keys_size);
  two_keys_size = WriteBatch::ApproximateSize(&batch);
  test::Tester::Tester
            ((Tester *)&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x80);
  test::Tester::IsLt<unsigned_long,unsigned_long>((Tester *)&local_1b0,&one_key_size,&two_keys_size)
  ;
  test::Tester::~Tester((Tester *)&local_1b0);
  local_1b0 = "box";
  local_1a8 = (char *)0x3;
  WriteBatch::Delete(&batch,(Slice *)&local_1b0);
  post_delete_size = WriteBatch::ApproximateSize(&batch);
  test::Tester::Tester
            ((Tester *)&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x84);
  test::Tester::IsLt<unsigned_long,unsigned_long>
            ((Tester *)&local_1b0,&two_keys_size,&post_delete_size);
  test::Tester::~Tester((Tester *)&local_1b0);
  WriteBatch::~WriteBatch(&batch);
  return;
}

Assistant:

TEST(WriteBatchTest, ApproximateSize) {
  WriteBatch batch;
  size_t empty_size = batch.ApproximateSize();

  batch.Put(Slice("foo"), Slice("bar"));
  size_t one_key_size = batch.ApproximateSize();
  ASSERT_LT(empty_size, one_key_size);

  batch.Put(Slice("baz"), Slice("boo"));
  size_t two_keys_size = batch.ApproximateSize();
  ASSERT_LT(one_key_size, two_keys_size);

  batch.Delete(Slice("box"));
  size_t post_delete_size = batch.ApproximateSize();
  ASSERT_LT(two_keys_size, post_delete_size);
}